

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Compiler::Compiler
          (Compiler *this,ScriptContext *scriptContext,ArenaAllocator *ctAllocator,
          ArenaAllocator *rtAllocator,StandardChars<char16_t> *standardChars,Program *program,
          DebugWriter *w,RegexStats *stats)

{
  DebugWriter *in_stack_00000008;
  
  this->scriptContext = scriptContext;
  this->ctAllocator = ctAllocator;
  this->rtAllocator = rtAllocator;
  this->standardChars = standardChars;
  this->w = in_stack_00000008;
  this->stats = (RegexStats *)w;
  this->program = program;
  this->instBuf = (uint8 *)0x0;
  this->instLen = 0;
  this->instNext = 0;
  this->nextLoopId = 0;
  return;
}

Assistant:

Compiler::Compiler
        ( Js::ScriptContext* scriptContext
        , ArenaAllocator* ctAllocator
        , ArenaAllocator* rtAllocator
        , StandardChars<Char>* standardChars
        , Program* program
#if ENABLE_REGEX_CONFIG_OPTIONS
        , DebugWriter* w
        , RegexStats* stats
#endif
        )
        : scriptContext(scriptContext)
        , ctAllocator(ctAllocator)
        , rtAllocator(rtAllocator)
        , standardChars(standardChars)
#if ENABLE_REGEX_CONFIG_OPTIONS
        , w(w)
        , stats(stats)
#endif
        , program(program)
        , instBuf(0)
        , instLen(0)
        , instNext(0)
        , nextLoopId(0)
    {}